

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O0

bool findDirs(string *path,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *dirsList)

{
  dirent64 *pdVar1;
  dirent **this;
  bool bVar2;
  char *__dir;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string dirName;
  dirent64 **ppdStack_28;
  int n;
  dirent **namelist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirsList_local;
  string *path_local;
  
  namelist = (dirent **)dirsList;
  dirsList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)path;
  __dir = (char *)std::__cxx11::string::c_str();
  dirName.field_2._12_4_ = scandir64(__dir,&stack0xffffffffffffffd8,(__selector *)0x0,(__cmp *)0x0);
  if ((int)dirName.field_2._12_4_ < 0) {
    path_local._7_1_ = false;
  }
  else {
    while (iVar3 = dirName.field_2._12_4_ + -1, dirName.field_2._12_4_ != 0) {
      dirName.field_2._12_4_ = iVar3;
      if (ppdStack_28[iVar3]->d_type == '\x04') {
        pdVar1 = ppdStack_28[iVar3];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,pdVar1->d_name,&local_51);
        std::allocator<char>::~allocator(&local_51);
        bVar2 = std::operator!=(".",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50);
        if ((bVar2) &&
           (bVar2 = std::operator!=("..",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_50), this = namelist, bVar2)) {
          std::operator+(&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         dirsList_local,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          std::operator+(&local_88,&local_a8,"/");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
        }
        std::__cxx11::string::~string((string *)local_50);
      }
      free(ppdStack_28[(int)dirName.field_2._12_4_]);
    }
    dirName.field_2._12_4_ = iVar3;
    free(ppdStack_28);
    path_local._7_1_ = true;
  }
  return path_local._7_1_;
}

Assistant:

bool findDirs(const string& path, vector<string>* dirsList)
{
    dirent** namelist;

    int n = scandir(path.c_str(), &namelist, 0, 0);  // alphasort);

    if (n < 0)
    {
        return false;
    }
    else
    {
        while (n--)
        {
            if (namelist[n]->d_type == DT_DIR)
            {
                string dirName(namelist[n]->d_name);

                // we save only normal ones
                if ("." != dirName && ".." != dirName)
                    dirsList->push_back(path + dirName + "/");
            }
            free(namelist[n]);
        }
        free(namelist);
    }

    return true;
}